

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::cancelUntil(Solver *this,int level)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if (level < (this->trail_lim).sz) {
    iVar4 = (this->trail).sz;
    lVar3 = (long)iVar4;
    piVar1 = (this->trail_lim).data;
    iVar2 = piVar1[level];
    if (iVar2 < iVar4) {
      do {
        lVar3 = lVar3 + -1;
        iVar4 = (this->trail).data[lVar3].x >> 1;
        (this->assigns).data[iVar4].value = '\x02';
        if ((1 < this->phase_saving) ||
           ((this->phase_saving == 1 &&
            ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar3)))) {
          (this->polarity).data[iVar4] = (byte)(this->trail).data[lVar3].x & 1;
        }
        if ((((this->order_heap).indices.sz <= iVar4) ||
            ((this->order_heap).indices.data[iVar4] < 0)) && ((this->decision).data[iVar4] != '\0'))
        {
          Heap<Gluco::Solver::VarOrderLt>::insert(&this->order_heap,iVar4);
        }
        piVar1 = (this->trail_lim).data;
        iVar2 = piVar1[level];
      } while (iVar2 < lVar3);
    }
    this->qhead = iVar2;
    vec<Gluco::Lit>::shrink(&this->trail,(this->trail).sz - piVar1[level]);
    vec<int>::shrink(&this->trail_lim,(this->trail_lim).sz - level);
    return;
  }
  return;
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || ((phase_saving == 1) && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } 
}